

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void __thiscall
Test_Template_RemoveStringFromTemplateCache::Test_Template_RemoveStringFromTemplateCache
          (Test_Template_RemoveStringFromTemplateCache *this)

{
  value_type local_18;
  Test_Template_RemoveStringFromTemplateCache *local_10;
  Test_Template_RemoveStringFromTemplateCache *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(Template, RemoveStringFromTemplateCache) {
  Template::ClearCache();   // just for exercise.
  const string cache_key = "TestRemoveStringFromTemplateCache";
  const string text = "<html>here today...</html>";

  TemplateDictionary dict("test");
  ASSERT(Template::StringToTemplateCache(cache_key, text));
  Template* tpl = Template::GetTemplate(cache_key, DO_NOT_STRIP);
  ASSERT(tpl);
  AssertExpandIs(tpl, &dict, text, true);
  tpl = Template::GetTemplate(cache_key, STRIP_WHITESPACE);
  ASSERT(tpl);
  AssertExpandIs(tpl, &dict, text, true);

  Template::RemoveStringFromTemplateCache(cache_key);
  tpl = Template::GetTemplate(cache_key, DO_NOT_STRIP);
  ASSERT(!tpl);
  tpl = Template::GetTemplate(cache_key, STRIP_WHITESPACE);
  ASSERT(!tpl);
  tpl = Template::GetTemplate(cache_key, STRIP_BLANK_LINES);
  ASSERT(!tpl);
}